

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::BadTable_&>::
MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::BadTable_&>
                *this,BadTable *container,MatchResultListener *listener)

{
  pointer pMVar1;
  bool bVar2;
  pointer pcVar3;
  ctrl_t *pcVar4;
  long lVar5;
  size_t irhs;
  long lVar6;
  size_t num_elements;
  size_t sVar7;
  iterator iVar8;
  iterator local_e8;
  ctrl_t *local_d8;
  size_t local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  vector<char,_std::allocator<char>_> did_match;
  MatchMatrix matrix;
  string local_60;
  DummyMatchResultListener dummy;
  
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  element_printouts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = (iterator)
          phmap::priv::
          raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
          ::begin(&container->
                   super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
                 );
  local_d8 = (container->
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
             ).ctrl_ + (container->
                       super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
                       ).capacity_;
  local_e8 = iVar8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&element_printouts);
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dummy.super_MatchResultListener.stream_ = (ostream *)0x0;
  dummy.super_MatchResultListener._vptr_MatchResultListener =
       (_func_int **)&PTR__MatchResultListener_001ab298;
  num_elements = 0;
  pcVar4 = iVar8.ctrl_;
  while (pcVar4 != local_d8) {
    if (listener->stream_ != (ostream *)0x0) {
      PrintToString<long>(&local_60,local_e8.field_1.slot_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &element_printouts,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    lVar5 = 0;
    local_d0 = num_elements;
    for (lVar6 = 0;
        pMVar1 = (this->matchers_).
                 super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar6 != ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x18;
        lVar6 = lVar6 + 1) {
      local_60._M_dataplus._M_p._0_1_ =
           MatcherBase<const_long_&>::MatchAndExplain
                     ((MatcherBase<const_long_&> *)
                      ((long)&(pMVar1->super_MatcherBase<const_long_&>).
                              super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                      lVar5),local_e8.field_1.slot_,&dummy.super_MatchResultListener);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&did_match,(char *)&local_60);
      lVar5 = lVar5 + 0x18;
    }
    num_elements = local_d0 + 1;
    phmap::priv::
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
    ::iterator::operator++(&local_e8);
    pcVar4 = local_e8.ctrl_;
  }
  MatchMatrix::MatchMatrix
            (&matrix,num_elements,
             ((long)(this->matchers_).
                    super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->matchers_).
                   super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pcVar3 = did_match.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  for (sVar7 = 0; sVar7 != num_elements; sVar7 = sVar7 + 1) {
    for (lVar5 = 0;
        lVar5 != ((long)(this->matchers_).
                        super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->matchers_).
                       super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18; lVar5 = lVar5 + 1) {
      matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5 + matrix.num_matchers_ * sVar7] = pcVar3[lVar5] != '\0'
      ;
    }
    pcVar3 = pcVar3 + lVar5;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&did_match.super__Vector_base<char,_std::allocator<char>_>);
  bVar2 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,&element_printouts,&matrix,
                     listener);
  if (bVar2) {
    bVar2 = UnorderedElementsAreMatcherImplBase::FindPairing
                      (&this->super_UnorderedElementsAreMatcherImplBase,&matrix,listener);
  }
  else {
    bVar2 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&element_printouts);
  return bVar2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }